

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

double macheps(void)

{
  undefined8 local_10;
  double macheps;
  
  for (local_10 = 1.0; 1.0 < local_10 + 1.0; local_10 = local_10 / 2.0) {
  }
  return local_10 * 2.0;
}

Assistant:

double macheps() {
	double macheps;
	macheps = 1.0;

	while ((macheps + 1.0) > 1.0) {
		macheps = macheps / 2.0;
	}

	macheps = macheps * 2;

	return macheps;
}